

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void __thiscall gl3cts::TextureSwizzle::Utils::programInfo::~programInfo(programInfo *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_program_object_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_object_id = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fragment_shader_id = 0;
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vertex_shader_id = 0;
  }
  return;
}

Assistant:

Utils::programInfo::~programInfo()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure program object is no longer used by GL */
	gl.useProgram(0);

	/* Clean program object */
	if (0 != m_program_object_id)
	{
		gl.deleteProgram(m_program_object_id);
		m_program_object_id = 0;
	}

	/* Clean shaders */
	if (0 != m_fragment_shader_id)
	{
		gl.deleteShader(m_fragment_shader_id);
		m_fragment_shader_id = 0;
	}

	if (0 != m_vertex_shader_id)
	{
		gl.deleteShader(m_vertex_shader_id);
		m_vertex_shader_id = 0;
	}
}